

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O2

void sf::priv::JoystickImpl::cleanup(EVP_PKEY_CTX *ctx)

{
  if ((anonymous_namespace)::udevMonitor != 0) {
    udev_monitor_unref();
    (anonymous_namespace)::udevMonitor = 0;
  }
  if ((anonymous_namespace)::udevContext != 0) {
    udev_unref();
    (anonymous_namespace)::udevContext = 0;
  }
  return;
}

Assistant:

void JoystickImpl::cleanup()
{
    // Unreference the udev monitor to destroy it
    if (udevMonitor)
    {
        udev_monitor_unref(udevMonitor);
        udevMonitor = 0;
    }

    // Unreference the udev context to destroy it
    if (udevContext)
    {
        udev_unref(udevContext);
        udevContext = 0;
    }
}